

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<short,(unsigned_char)8>>(Thread *this)

{
  u8 i;
  long lVar1;
  uint value;
  uint uVar2;
  Simd<short,_(unsigned_char)__b_> val;
  
  val = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  value = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    uVar2 = 1 << ((byte)lVar1 & 0x1f);
    if (-1 < val.v[lVar1]) {
      uVar2 = 0;
    }
    value = value | uVar2;
  }
  Push<unsigned_int>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}